

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O0

curl_llist * Curl_llist_alloc(curl_llist_dtor dtor)

{
  curl_llist *list;
  curl_llist_dtor dtor_local;
  
  dtor_local = (curl_llist_dtor)(*Curl_cmalloc)(0x20);
  if ((curl_llist *)dtor_local == (curl_llist *)0x0) {
    dtor_local = (curl_llist_dtor)0x0;
  }
  else {
    llist_init((curl_llist *)dtor_local,dtor);
  }
  return (curl_llist *)dtor_local;
}

Assistant:

struct curl_llist *
Curl_llist_alloc(curl_llist_dtor dtor)
{
  struct curl_llist *list;

  list = malloc(sizeof(struct curl_llist));
  if(!list)
    return NULL;

  llist_init(list, dtor);

  return list;
}